

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     PutTestObject<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>,_256UL,_128UL>
     ::reentrant_consume(reentrant_consume_operation *i_consume)

{
  bool bVar1;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>
  *this;
  TestObject<256UL,_128UL> *this_00;
  reentrant_consume_operation *i_consume_local;
  
  this = (TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>
          *)density::
            heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
            ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)i_consume);
  bVar1 = TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>
          ::is<density_tests::TestObject<256ul,128ul>>(this);
  if (!bVar1) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x156);
  }
  this_00 = density::
            heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
            ::reentrant_consume_operation::element<density_tests::TestObject<256ul,128ul>>
                      ((reentrant_consume_operation *)i_consume);
  TestObject<256UL,_128UL>::check(this_00);
  return;
}

Assistant:

static void
              reentrant_consume(const typename QUEUE::reentrant_consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                i_consume.template element<ElementType>().check();
            }